

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::copyGroupElements
          (TraverseSchema *this,DOMElement *elem,XercesGroupInfo *fromGroup,XercesGroupInfo *toGroup
          ,ComplexTypeInfo *typeInfo)

{
  uint uVar1;
  XMLSize_t XVar2;
  QName *pQVar3;
  XMLCh *text1;
  int iVar4;
  SchemaElementDecl *elem_00;
  undefined4 extraout_var;
  uint uVar6;
  XMLSize_t i;
  XMLSize_t index;
  long lVar5;
  
  XVar2 = (fromGroup->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
  if (typeInfo == (ComplexTypeInfo *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = typeInfo->fScopeDefined;
    fromGroup->fCheckElementConsistency = false;
  }
  index = 0;
  do {
    if (XVar2 == index) {
      return;
    }
    elem_00 = XercesGroupInfo::elementAt(fromGroup,index);
    if (typeInfo == (ComplexTypeInfo *)0x0) {
joined_r0x0031ee98:
      if (toGroup != (XercesGroupInfo *)0x0) {
        XercesGroupInfo::addElement(toGroup,elem_00);
      }
    }
    else {
      uVar1 = elem_00->fEnclosingScope;
      if (uVar1 == 0xfffffffe) {
LAB_0031eeb5:
        ComplexTypeInfo::addElement(typeInfo,elem_00);
        goto joined_r0x0031ee98;
      }
      pQVar3 = (elem_00->super_XMLElementDecl).fElementName;
      text1 = pQVar3->fLocalPart;
      iVar4 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                        (this->fSchemaGrammar,(ulong)pQVar3->fURIId,text1,0,(ulong)uVar6);
      lVar5 = CONCAT44(extraout_var,iVar4);
      if (lVar5 == 0) {
        elem_00->fEnclosingScope = uVar6;
        SchemaGrammar::putGroupElemDecl(this->fSchemaGrammar,&elem_00->super_XMLElementDecl);
        elem_00->fEnclosingScope = uVar1;
        goto LAB_0031eeb5;
      }
      if ((elem_00->fComplexTypeInfo != *(ComplexTypeInfo **)(lVar5 + 0x50)) ||
         (elem_00->fDatatypeValidator != *(DatatypeValidator **)(lVar5 + 0x78))) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x43,text1,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void TraverseSchema::copyGroupElements(const DOMElement* const elem,
                                       XercesGroupInfo* const fromGroup,
                                       XercesGroupInfo* const toGroup,
                                       ComplexTypeInfo* const typeInfo) {

    XMLSize_t elemCount = fromGroup->elementCount();
    int newScope = (typeInfo) ? typeInfo->getScopeDefined() : 0;

    if (typeInfo)
        fromGroup->setCheckElementConsistency(false);

    for (XMLSize_t i = 0; i < elemCount; i++) {

        SchemaElementDecl*       elemDecl = fromGroup->elementAt(i);

        if (typeInfo) {

            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                int                      elemURI = elemDecl->getURI();
                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                        fSchemaGrammar->getElemDecl(elemURI, localPart, 0, newScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                       reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }

                elemDecl->setEnclosingScope(newScope);
                fSchemaGrammar->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            typeInfo->addElement(elemDecl);
        }

        if (toGroup) {
            toGroup->addElement(elemDecl);
        }
    }
}